

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::initInstructions(ExecutionEngine *this)

{
  this->_instructionFunctions[0] = (FunctionPointer)i_nop;
  this->_instructionFunctions[1] = 0;
  this->_instructionFunctions[2] = (FunctionPointer)i_aconst_null;
  this->_instructionFunctions[3] = 0;
  this->_instructionFunctions[4] = (FunctionPointer)i_iconst_m1;
  this->_instructionFunctions[5] = 0;
  this->_instructionFunctions[6] = (FunctionPointer)i_iconst_0;
  this->_instructionFunctions[7] = 0;
  this->_instructionFunctions[8] = (FunctionPointer)i_iconst_1;
  this->_instructionFunctions[9] = 0;
  this->_instructionFunctions[10] = (FunctionPointer)i_iconst_2;
  this->_instructionFunctions[0xb] = 0;
  this->_instructionFunctions[0xc] = (FunctionPointer)i_iconst_3;
  this->_instructionFunctions[0xd] = 0;
  this->_instructionFunctions[0xe] = (FunctionPointer)i_iconst_4;
  this->_instructionFunctions[0xf] = 0;
  this->_instructionFunctions[0x10] = (FunctionPointer)i_iconst_5;
  this->_instructionFunctions[0x11] = 0;
  this->_instructionFunctions[0x12] = (FunctionPointer)i_lconst_0;
  this->_instructionFunctions[0x13] = 0;
  this->_instructionFunctions[0x14] = (FunctionPointer)i_lconst_1;
  this->_instructionFunctions[0x15] = 0;
  this->_instructionFunctions[0x16] = (FunctionPointer)i_fconst_0;
  this->_instructionFunctions[0x17] = 0;
  this->_instructionFunctions[0x18] = (FunctionPointer)i_fconst_1;
  this->_instructionFunctions[0x19] = 0;
  this->_instructionFunctions[0x1a] = (FunctionPointer)i_fconst_2;
  this->_instructionFunctions[0x1b] = 0;
  this->_instructionFunctions[0x1c] = (FunctionPointer)i_dconst_0;
  this->_instructionFunctions[0x1d] = 0;
  this->_instructionFunctions[0x1e] = (FunctionPointer)i_dconst_1;
  this->_instructionFunctions[0x1f] = 0;
  this->_instructionFunctions[0x20] = (FunctionPointer)i_bipush;
  this->_instructionFunctions[0x21] = 0;
  this->_instructionFunctions[0x22] = (FunctionPointer)i_sipush;
  this->_instructionFunctions[0x23] = 0;
  this->_instructionFunctions[0x24] = (FunctionPointer)i_ldc;
  this->_instructionFunctions[0x25] = 0;
  this->_instructionFunctions[0x26] = (FunctionPointer)i_ldc_w;
  this->_instructionFunctions[0x27] = 0;
  this->_instructionFunctions[0x28] = (FunctionPointer)i_ldc2_w;
  this->_instructionFunctions[0x29] = 0;
  this->_instructionFunctions[0x2a] = (FunctionPointer)i_iload;
  this->_instructionFunctions[0x2b] = 0;
  this->_instructionFunctions[0x2c] = (FunctionPointer)i_lload;
  this->_instructionFunctions[0x2d] = 0;
  this->_instructionFunctions[0x2e] = (FunctionPointer)i_fload;
  this->_instructionFunctions[0x2f] = 0;
  this->_instructionFunctions[0x30] = (FunctionPointer)i_dload;
  this->_instructionFunctions[0x31] = 0;
  this->_instructionFunctions[0x32] = (FunctionPointer)i_aload;
  this->_instructionFunctions[0x33] = 0;
  this->_instructionFunctions[0x34] = (FunctionPointer)i_iload_0;
  this->_instructionFunctions[0x35] = 0;
  this->_instructionFunctions[0x36] = (FunctionPointer)i_iload_1;
  this->_instructionFunctions[0x37] = 0;
  this->_instructionFunctions[0x38] = (FunctionPointer)i_iload_2;
  this->_instructionFunctions[0x39] = 0;
  this->_instructionFunctions[0x3a] = (FunctionPointer)i_iload_3;
  this->_instructionFunctions[0x3b] = 0;
  this->_instructionFunctions[0x3c] = (FunctionPointer)i_lload_0;
  this->_instructionFunctions[0x3d] = 0;
  this->_instructionFunctions[0x3e] = (FunctionPointer)i_lload_1;
  this->_instructionFunctions[0x3f] = 0;
  this->_instructionFunctions[0x40] = (FunctionPointer)i_lload_2;
  this->_instructionFunctions[0x41] = 0;
  this->_instructionFunctions[0x42] = (FunctionPointer)i_lload_3;
  this->_instructionFunctions[0x43] = 0;
  this->_instructionFunctions[0x44] = (FunctionPointer)i_fload_0;
  this->_instructionFunctions[0x45] = 0;
  this->_instructionFunctions[0x46] = (FunctionPointer)i_fload_1;
  this->_instructionFunctions[0x47] = 0;
  this->_instructionFunctions[0x48] = (FunctionPointer)i_fload_2;
  this->_instructionFunctions[0x49] = 0;
  this->_instructionFunctions[0x4a] = (FunctionPointer)i_fload_3;
  this->_instructionFunctions[0x4b] = 0;
  this->_instructionFunctions[0x4c] = (FunctionPointer)i_dload_0;
  this->_instructionFunctions[0x4d] = 0;
  this->_instructionFunctions[0x4e] = (FunctionPointer)i_dload_1;
  this->_instructionFunctions[0x4f] = 0;
  this->_instructionFunctions[0x50] = (FunctionPointer)i_dload_2;
  this->_instructionFunctions[0x51] = 0;
  this->_instructionFunctions[0x52] = (FunctionPointer)i_dload_3;
  this->_instructionFunctions[0x53] = 0;
  this->_instructionFunctions[0x54] = (FunctionPointer)i_aload_0;
  this->_instructionFunctions[0x55] = 0;
  this->_instructionFunctions[0x56] = (FunctionPointer)i_aload_1;
  this->_instructionFunctions[0x57] = 0;
  this->_instructionFunctions[0x58] = (FunctionPointer)i_aload_2;
  this->_instructionFunctions[0x59] = 0;
  this->_instructionFunctions[0x5a] = (FunctionPointer)i_aload_3;
  this->_instructionFunctions[0x5b] = 0;
  this->_instructionFunctions[0x5c] = (FunctionPointer)i_iaload;
  this->_instructionFunctions[0x5d] = 0;
  this->_instructionFunctions[0x5e] = (FunctionPointer)i_laload;
  this->_instructionFunctions[0x5f] = 0;
  this->_instructionFunctions[0x60] = (FunctionPointer)i_faload;
  this->_instructionFunctions[0x61] = 0;
  this->_instructionFunctions[0x62] = (FunctionPointer)i_daload;
  this->_instructionFunctions[99] = 0;
  this->_instructionFunctions[100] = (FunctionPointer)i_aaload;
  this->_instructionFunctions[0x65] = 0;
  this->_instructionFunctions[0x66] = (FunctionPointer)i_baload;
  this->_instructionFunctions[0x67] = 0;
  this->_instructionFunctions[0x68] = (FunctionPointer)i_caload;
  this->_instructionFunctions[0x69] = 0;
  this->_instructionFunctions[0x6a] = (FunctionPointer)i_saload;
  this->_instructionFunctions[0x6b] = 0;
  this->_instructionFunctions[0x6c] = (FunctionPointer)i_istore;
  this->_instructionFunctions[0x6d] = 0;
  this->_instructionFunctions[0x6e] = (FunctionPointer)i_lstore;
  this->_instructionFunctions[0x6f] = 0;
  this->_instructionFunctions[0x70] = (FunctionPointer)i_fstore;
  this->_instructionFunctions[0x71] = 0;
  this->_instructionFunctions[0x72] = (FunctionPointer)i_dstore;
  this->_instructionFunctions[0x73] = 0;
  this->_instructionFunctions[0x74] = (FunctionPointer)i_astore;
  this->_instructionFunctions[0x75] = 0;
  this->_instructionFunctions[0x76] = (FunctionPointer)i_istore_0;
  this->_instructionFunctions[0x77] = 0;
  this->_instructionFunctions[0x78] = (FunctionPointer)i_istore_1;
  this->_instructionFunctions[0x79] = 0;
  this->_instructionFunctions[0x7a] = (FunctionPointer)i_istore_2;
  this->_instructionFunctions[0x7b] = 0;
  this->_instructionFunctions[0x7c] = (FunctionPointer)i_istore_3;
  this->_instructionFunctions[0x7d] = 0;
  this->_instructionFunctions[0x7e] = (FunctionPointer)i_lstore_0;
  this->_instructionFunctions[0x7f] = 0;
  this->_instructionFunctions[0x80] = (FunctionPointer)i_lstore_1;
  this->_instructionFunctions[0x81] = 0;
  this->_instructionFunctions[0x82] = (FunctionPointer)i_lstore_2;
  this->_instructionFunctions[0x83] = 0;
  this->_instructionFunctions[0x84] = (FunctionPointer)i_lstore_3;
  this->_instructionFunctions[0x85] = 0;
  this->_instructionFunctions[0x86] = (FunctionPointer)i_fstore_0;
  this->_instructionFunctions[0x87] = 0;
  this->_instructionFunctions[0x88] = (FunctionPointer)i_fstore_1;
  this->_instructionFunctions[0x89] = 0;
  this->_instructionFunctions[0x8a] = (FunctionPointer)i_fstore_2;
  this->_instructionFunctions[0x8b] = 0;
  this->_instructionFunctions[0x8c] = (FunctionPointer)i_fstore_3;
  this->_instructionFunctions[0x8d] = 0;
  this->_instructionFunctions[0x8e] = (FunctionPointer)i_dstore_0;
  this->_instructionFunctions[0x8f] = 0;
  this->_instructionFunctions[0x90] = (FunctionPointer)i_dstore_1;
  this->_instructionFunctions[0x91] = 0;
  this->_instructionFunctions[0x92] = (FunctionPointer)i_dstore_2;
  this->_instructionFunctions[0x93] = 0;
  this->_instructionFunctions[0x94] = (FunctionPointer)i_dstore_3;
  this->_instructionFunctions[0x95] = 0;
  this->_instructionFunctions[0x96] = (FunctionPointer)i_astore_0;
  this->_instructionFunctions[0x97] = 0;
  this->_instructionFunctions[0x98] = (FunctionPointer)i_astore_1;
  this->_instructionFunctions[0x99] = 0;
  this->_instructionFunctions[0x9a] = (FunctionPointer)i_astore_2;
  this->_instructionFunctions[0x9b] = 0;
  this->_instructionFunctions[0x9c] = (FunctionPointer)i_astore_3;
  this->_instructionFunctions[0x9d] = 0;
  this->_instructionFunctions[0x9e] = (FunctionPointer)i_iastore;
  this->_instructionFunctions[0x9f] = 0;
  this->_instructionFunctions[0xa0] = (FunctionPointer)i_lastore;
  this->_instructionFunctions[0xa1] = 0;
  this->_instructionFunctions[0xa2] = (FunctionPointer)i_fastore;
  this->_instructionFunctions[0xa3] = 0;
  this->_instructionFunctions[0xa4] = (FunctionPointer)i_dastore;
  this->_instructionFunctions[0xa5] = 0;
  this->_instructionFunctions[0xa6] = (FunctionPointer)i_aastore;
  this->_instructionFunctions[0xa7] = 0;
  this->_instructionFunctions[0xa8] = (FunctionPointer)i_bastore;
  this->_instructionFunctions[0xa9] = 0;
  this->_instructionFunctions[0xaa] = (FunctionPointer)i_castore;
  this->_instructionFunctions[0xab] = 0;
  this->_instructionFunctions[0xac] = (FunctionPointer)i_sastore;
  this->_instructionFunctions[0xad] = 0;
  this->_instructionFunctions[0xae] = (FunctionPointer)i_pop;
  this->_instructionFunctions[0xaf] = 0;
  this->_instructionFunctions[0xb0] = (FunctionPointer)i_pop2;
  this->_instructionFunctions[0xb1] = 0;
  this->_instructionFunctions[0xb2] = (FunctionPointer)i_dup;
  this->_instructionFunctions[0xb3] = 0;
  this->_instructionFunctions[0xb4] = (FunctionPointer)i_dup2_x1;
  this->_instructionFunctions[0xb5] = 0;
  this->_instructionFunctions[0xb6] = (FunctionPointer)i_dup2_x2;
  this->_instructionFunctions[0xb7] = 0;
  this->_instructionFunctions[0xb8] = (FunctionPointer)i_dup2;
  this->_instructionFunctions[0xb9] = 0;
  this->_instructionFunctions[0xba] = (FunctionPointer)i_dup2_x1;
  this->_instructionFunctions[0xbb] = 0;
  this->_instructionFunctions[0xbc] = (FunctionPointer)i_dup2_x2;
  this->_instructionFunctions[0xbd] = 0;
  this->_instructionFunctions[0xbe] = (FunctionPointer)i_swap;
  this->_instructionFunctions[0xbf] = 0;
  this->_instructionFunctions[0xc0] = (FunctionPointer)i_iadd;
  this->_instructionFunctions[0xc1] = 0;
  this->_instructionFunctions[0xc2] = (FunctionPointer)i_ladd;
  this->_instructionFunctions[0xc3] = 0;
  this->_instructionFunctions[0xc4] = (FunctionPointer)i_fadd;
  this->_instructionFunctions[0xc5] = 0;
  this->_instructionFunctions[0xc6] = (FunctionPointer)i_dadd;
  this->_instructionFunctions[199] = 0;
  this->_instructionFunctions[200] = (FunctionPointer)i_isub;
  this->_instructionFunctions[0xc9] = 0;
  *(code **)&this->field_0x658 = i_lsub;
  *(undefined8 *)&this->field_0x660 = 0;
  *(code **)&this->field_0x668 = i_fsub;
  *(undefined8 *)&this->field_0x670 = 0;
  *(code **)&this->field_0x678 = i_dsub;
  *(undefined8 *)&this->field_0x680 = 0;
  *(code **)&this->field_0x688 = i_imul;
  *(undefined8 *)&this->field_0x690 = 0;
  *(code **)&this->field_0x698 = i_lmul;
  *(undefined8 *)&this->field_0x6a0 = 0;
  *(code **)&this->field_0x6a8 = i_fmul;
  *(undefined8 *)&this->field_0x6b0 = 0;
  *(code **)&this->field_0x6b8 = i_dmul;
  *(undefined8 *)&this->field_0x6c0 = 0;
  *(code **)&this->field_0x6c8 = i_idiv;
  *(undefined8 *)&this->field_0x6d0 = 0;
  *(code **)&this->field_0x6d8 = i_ldiv;
  *(undefined8 *)&this->field_0x6e0 = 0;
  *(code **)&this->field_0x6e8 = i_fdiv;
  *(undefined8 *)&this->field_0x6f0 = 0;
  *(code **)&this->field_0x6f8 = i_ddiv;
  *(undefined8 *)&this->field_0x700 = 0;
  *(code **)&this->field_0x708 = i_irem;
  *(undefined8 *)&this->field_0x710 = 0;
  *(code **)&this->field_0x718 = i_lrem;
  *(undefined8 *)&this->field_0x720 = 0;
  *(code **)&this->field_0x728 = i_frem;
  *(undefined8 *)&this->field_0x730 = 0;
  *(code **)&this->field_0x738 = i_drem;
  *(undefined8 *)&this->field_0x740 = 0;
  *(code **)&this->field_0x748 = i_ineg;
  *(undefined8 *)&this->field_0x750 = 0;
  *(code **)&this->field_0x758 = i_lneg;
  *(undefined8 *)&this->field_0x760 = 0;
  *(code **)&this->field_0x768 = i_fneg;
  *(undefined8 *)&this->field_0x770 = 0;
  *(code **)&this->field_0x778 = i_dneg;
  *(undefined8 *)&this->field_0x780 = 0;
  *(code **)&this->field_0x788 = i_ishl;
  *(undefined8 *)&this->field_0x790 = 0;
  *(code **)&this->field_0x798 = i_lshl;
  *(undefined8 *)&this->field_0x7a0 = 0;
  *(code **)&this->field_0x7a8 = i_ishr;
  *(undefined8 *)&this->field_0x7b0 = 0;
  *(code **)&this->field_0x7b8 = i_lshr;
  *(undefined8 *)&this->field_0x7c0 = 0;
  *(code **)&this->field_0x7c8 = i_iushr;
  *(undefined8 *)&this->field_0x7d0 = 0;
  *(code **)&this->field_0x7d8 = i_lushr;
  *(undefined8 *)&this->field_0x7e0 = 0;
  *(code **)&this->field_0x7e8 = i_iand;
  *(undefined8 *)&this->field_0x7f0 = 0;
  *(code **)&this->field_0x7f8 = i_land;
  *(undefined8 *)&this->field_0x800 = 0;
  *(code **)&this->field_0x808 = i_ior;
  *(undefined8 *)&this->field_0x810 = 0;
  *(code **)&this->field_0x818 = i_lor;
  *(undefined8 *)&this->field_0x820 = 0;
  *(code **)&this->field_0x828 = i_ixor;
  *(undefined8 *)&this->field_0x830 = 0;
  *(code **)&this->field_0x838 = i_lxor;
  *(undefined8 *)&this->field_0x840 = 0;
  *(code **)&this->field_0x848 = i_iinc;
  *(undefined8 *)&this->field_0x850 = 0;
  *(code **)&this->field_0x858 = i_i2l;
  *(undefined8 *)&this->field_0x860 = 0;
  *(code **)&this->field_0x868 = i_i2f;
  *(undefined8 *)&this->field_0x870 = 0;
  *(code **)&this->field_0x878 = i_i2d;
  *(undefined8 *)&this->field_0x880 = 0;
  *(code **)&this->field_0x888 = i_l2i;
  *(undefined8 *)&this->field_0x890 = 0;
  *(code **)&this->field_0x898 = i_l2f;
  *(undefined8 *)&this->field_0x8a0 = 0;
  *(code **)&this->field_0x8a8 = i_l2d;
  *(undefined8 *)&this->field_0x8b0 = 0;
  *(code **)&this->field_0x8b8 = i_f2i;
  *(undefined8 *)&this->field_0x8c0 = 0;
  *(code **)&this->field_0x8c8 = i_f2l;
  *(undefined8 *)&this->field_0x8d0 = 0;
  *(code **)&this->field_0x8d8 = i_f2d;
  *(undefined8 *)&this->field_0x8e0 = 0;
  *(code **)&this->field_0x8e8 = i_d2i;
  *(undefined8 *)&this->field_0x8f0 = 0;
  *(code **)&this->field_0x8f8 = i_d2l;
  *(undefined8 *)&this->field_0x900 = 0;
  *(code **)&this->field_0x908 = i_d2f;
  *(undefined8 *)&this->field_0x910 = 0;
  *(code **)&this->field_0x918 = i_i2b;
  *(undefined8 *)&this->field_0x920 = 0;
  *(code **)&this->field_0x928 = i_i2c;
  *(undefined8 *)&this->field_0x930 = 0;
  *(code **)&this->field_0x938 = i_i2s;
  *(undefined8 *)&this->field_0x940 = 0;
  *(code **)&this->field_0x948 = i_lcmp;
  *(undefined8 *)&this->field_0x950 = 0;
  *(code **)&this->field_0x958 = i_fcmpl;
  *(undefined8 *)&this->field_0x960 = 0;
  *(code **)&this->field_0x968 = i_fcmpg;
  *(undefined8 *)&this->field_0x970 = 0;
  *(code **)&this->field_0x978 = i_dcmpl;
  *(undefined8 *)&this->field_0x980 = 0;
  *(code **)&this->field_0x988 = i_dcmpg;
  *(undefined8 *)&this->field_0x990 = 0;
  *(code **)&this->field_0x998 = i_ifeq;
  *(undefined8 *)&this->field_0x9a0 = 0;
  *(code **)&this->field_0x9a8 = i_ifne;
  *(undefined8 *)&this->field_0x9b0 = 0;
  *(code **)&this->field_0x9b8 = i_iflt;
  *(undefined8 *)&this->field_0x9c0 = 0;
  *(code **)&this->field_0x9c8 = i_ifge;
  *(undefined8 *)&this->field_0x9d0 = 0;
  *(code **)&this->field_0x9d8 = i_ifgt;
  *(undefined8 *)&this->field_0x9e0 = 0;
  *(code **)&this->field_0x9e8 = i_ifle;
  *(undefined8 *)&this->field_0x9f0 = 0;
  *(code **)&this->field_0x9f8 = i_if_icmpeq;
  *(undefined8 *)&this->field_0xa00 = 0;
  *(code **)&this->field_0xa08 = i_if_icmpne;
  *(undefined8 *)&this->field_0xa10 = 0;
  *(code **)&this->field_0xa18 = i_if_icmplt;
  *(undefined8 *)&this->field_0xa20 = 0;
  *(code **)&this->field_0xa28 = i_if_icmpge;
  *(undefined8 *)&this->field_0xa30 = 0;
  *(code **)&this->field_0xa38 = i_if_icmpgt;
  *(undefined8 *)&this->field_0xa40 = 0;
  *(code **)&this->field_0xa48 = i_if_icmple;
  *(undefined8 *)&this->field_0xa50 = 0;
  *(code **)&this->field_0xa58 = i_if_acmpeq;
  *(undefined8 *)&this->field_0xa60 = 0;
  *(code **)&this->field_0xa68 = i_if_acmpne;
  *(undefined8 *)&this->field_0xa70 = 0;
  *(code **)&this->field_0xa78 = i_goto;
  *(undefined8 *)&this->field_0xa80 = 0;
  *(code **)&this->field_0xa88 = i_jsr;
  *(undefined8 *)&this->field_0xa90 = 0;
  *(code **)&this->field_0xa98 = i_ret;
  *(undefined8 *)&this->field_0xaa0 = 0;
  *(code **)&this->field_0xaa8 = i_tableswitch;
  *(undefined8 *)&this->field_0xab0 = 0;
  *(code **)&this->field_0xab8 = i_lookupswitch;
  *(undefined8 *)&this->field_0xac0 = 0;
  *(code **)&this->field_0xac8 = i_ireturn;
  *(undefined8 *)&this->field_0xad0 = 0;
  *(code **)&this->field_0xad8 = i_lreturn;
  *(undefined8 *)&this->field_0xae0 = 0;
  *(code **)&this->field_0xae8 = i_freturn;
  *(undefined8 *)&this->field_0xaf0 = 0;
  *(code **)&this->field_0xaf8 = i_dreturn;
  *(undefined8 *)&this->field_0xb00 = 0;
  *(code **)&this->field_0xb08 = i_areturn;
  *(undefined8 *)&this->field_0xb10 = 0;
  *(code **)&this->field_0xb18 = i_return;
  *(undefined8 *)&this->field_0xb20 = 0;
  *(code **)&this->field_0xb28 = i_getstatic;
  *(undefined8 *)&this->field_0xb30 = 0;
  *(code **)&this->field_0xb38 = i_putstatic;
  *(undefined8 *)&this->field_0xb40 = 0;
  *(code **)&this->field_0xb48 = i_getfield;
  *(undefined8 *)&this->field_0xb50 = 0;
  *(code **)&this->field_0xb58 = i_putfield;
  *(undefined8 *)&this->field_0xb60 = 0;
  *(code **)&this->field_0xb68 = i_invokevirtual;
  *(undefined8 *)&this->field_0xb70 = 0;
  *(code **)&this->field_0xb78 = i_invokespecial;
  *(undefined8 *)&this->field_0xb80 = 0;
  *(code **)&this->field_0xb88 = i_invokestatic;
  *(undefined8 *)&this->field_0xb90 = 0;
  *(code **)&this->field_0xb98 = i_invokeinterface;
  *(undefined8 *)&this->field_0xba0 = 0;
  *(code **)&this->field_0xbb8 = i_new;
  *(undefined8 *)&this->field_0xbc0 = 0;
  *(code **)&this->field_0xbc8 = i_newarray;
  *(undefined8 *)&this->field_0xbd0 = 0;
  *(code **)&this->field_0xbd8 = i_anewarray;
  *(undefined8 *)&this->field_0xbe0 = 0;
  *(code **)&this->field_0xbe8 = i_arraylength;
  *(undefined8 *)&this->field_0xbf0 = 0;
  *(code **)&this->field_0xbf8 = i_athrow;
  *(undefined8 *)&this->field_0xc00 = 0;
  *(code **)&this->field_0xc08 = i_checkcast;
  *(undefined8 *)&this->field_0xc10 = 0;
  *(code **)&this->field_0xc18 = i_instanceof;
  *(undefined8 *)&this->field_0xc20 = 0;
  *(code **)&this->field_0xc28 = i_monitorenter;
  *(undefined8 *)&this->field_0xc30 = 0;
  *(code **)&this->field_0xc38 = i_monitorexit;
  *(undefined8 *)&this->field_0xc40 = 0;
  *(code **)&this->field_0xc48 = i_wide;
  *(undefined8 *)&this->field_0xc50 = 0;
  *(code **)&this->field_0xc58 = i_multianewarray;
  *(undefined8 *)&this->field_0xc60 = 0;
  *(code **)&this->field_0xc68 = i_ifnull;
  *(undefined8 *)&this->field_0xc70 = 0;
  *(code **)&this->field_0xc78 = i_ifnonnull;
  *(undefined8 *)&this->field_0xc80 = 0;
  *(code **)&this->field_0xc88 = i_goto_w;
  *(undefined8 *)&this->field_0xc90 = 0;
  *(code **)&this->field_0xc98 = i_jsr_w;
  *(undefined8 *)&this->field_0xca0 = 0;
  return;
}

Assistant:

void ExecutionEngine::initInstructions() {
    _instructionFunctions[0x00] = &ExecutionEngine::i_nop;
    _instructionFunctions[0x01] = &ExecutionEngine::i_aconst_null;
    _instructionFunctions[0x02] = &ExecutionEngine::i_iconst_m1;
    _instructionFunctions[0x03] = &ExecutionEngine::i_iconst_0;
    _instructionFunctions[0x04] = &ExecutionEngine::i_iconst_1;
    _instructionFunctions[0x05] = &ExecutionEngine::i_iconst_2;
    _instructionFunctions[0x06] = &ExecutionEngine::i_iconst_3;
    _instructionFunctions[0x07] = &ExecutionEngine::i_iconst_4;
    _instructionFunctions[0x08] = &ExecutionEngine::i_iconst_5;
    _instructionFunctions[0x09] = &ExecutionEngine::i_lconst_0;
    _instructionFunctions[0x0a] = &ExecutionEngine::i_lconst_1;
    _instructionFunctions[0x0b] = &ExecutionEngine::i_fconst_0;
    _instructionFunctions[0x0c] = &ExecutionEngine::i_fconst_1;
    _instructionFunctions[0x0d] = &ExecutionEngine::i_fconst_2;
    _instructionFunctions[0x0e] = &ExecutionEngine::i_dconst_0;
    _instructionFunctions[0x0f] = &ExecutionEngine::i_dconst_1;
    _instructionFunctions[0x10] = &ExecutionEngine::i_bipush;
    _instructionFunctions[0x11] = &ExecutionEngine::i_sipush;
    _instructionFunctions[0x12] = &ExecutionEngine::i_ldc;
    _instructionFunctions[0x13] = &ExecutionEngine::i_ldc_w;
    _instructionFunctions[0x14] = &ExecutionEngine::i_ldc2_w;
    _instructionFunctions[0x15] = &ExecutionEngine::i_iload;
    _instructionFunctions[0x16] = &ExecutionEngine::i_lload;
    _instructionFunctions[0x17] = &ExecutionEngine::i_fload;
    _instructionFunctions[0x18] = &ExecutionEngine::i_dload;
    _instructionFunctions[0x19] = &ExecutionEngine::i_aload;
    _instructionFunctions[0x1a] = &ExecutionEngine::i_iload_0;
    _instructionFunctions[0x1b] = &ExecutionEngine::i_iload_1;
    _instructionFunctions[0x1c] = &ExecutionEngine::i_iload_2;
    _instructionFunctions[0x1d] = &ExecutionEngine::i_iload_3;
    _instructionFunctions[0x1e] = &ExecutionEngine::i_lload_0;
    _instructionFunctions[0x1f] = &ExecutionEngine::i_lload_1;
    _instructionFunctions[0x20] = &ExecutionEngine::i_lload_2;
    _instructionFunctions[0x21] = &ExecutionEngine::i_lload_3;
    _instructionFunctions[0x22] = &ExecutionEngine::i_fload_0;
    _instructionFunctions[0x23] = &ExecutionEngine::i_fload_1;
    _instructionFunctions[0x24] = &ExecutionEngine::i_fload_2;
    _instructionFunctions[0x25] = &ExecutionEngine::i_fload_3;
    _instructionFunctions[0x26] = &ExecutionEngine::i_dload_0;
    _instructionFunctions[0x27] = &ExecutionEngine::i_dload_1;
    _instructionFunctions[0x28] = &ExecutionEngine::i_dload_2;
    _instructionFunctions[0x29] = &ExecutionEngine::i_dload_3;
    _instructionFunctions[0x2a] = &ExecutionEngine::i_aload_0;
    _instructionFunctions[0x2b] = &ExecutionEngine::i_aload_1;
    _instructionFunctions[0x2c] = &ExecutionEngine::i_aload_2;
    _instructionFunctions[0x2d] = &ExecutionEngine::i_aload_3;
    _instructionFunctions[0x2e] = &ExecutionEngine::i_iaload;
    _instructionFunctions[0x2f] = &ExecutionEngine::i_laload;
    _instructionFunctions[0x30] = &ExecutionEngine::i_faload;
    _instructionFunctions[0x31] = &ExecutionEngine::i_daload;
    _instructionFunctions[0x32] = &ExecutionEngine::i_aaload;
    _instructionFunctions[0x33] = &ExecutionEngine::i_baload;
    _instructionFunctions[0x34] = &ExecutionEngine::i_caload;
    _instructionFunctions[0x35] = &ExecutionEngine::i_saload;
    _instructionFunctions[0x36] = &ExecutionEngine::i_istore;
    _instructionFunctions[0x37] = &ExecutionEngine::i_lstore;
    _instructionFunctions[0x38] = &ExecutionEngine::i_fstore;
    _instructionFunctions[0x39] = &ExecutionEngine::i_dstore;
    _instructionFunctions[0x3a] = &ExecutionEngine::i_astore;
    _instructionFunctions[0x3b] = &ExecutionEngine::i_istore_0;
    _instructionFunctions[0x3c] = &ExecutionEngine::i_istore_1;
    _instructionFunctions[0x3d] = &ExecutionEngine::i_istore_2;
    _instructionFunctions[0x3e] = &ExecutionEngine::i_istore_3;
    _instructionFunctions[0x3f] = &ExecutionEngine::i_lstore_0;
    _instructionFunctions[0x40] = &ExecutionEngine::i_lstore_1;
    _instructionFunctions[0x41] = &ExecutionEngine::i_lstore_2;
    _instructionFunctions[0x42] = &ExecutionEngine::i_lstore_3;
    _instructionFunctions[0x43] = &ExecutionEngine::i_fstore_0;
    _instructionFunctions[0x44] = &ExecutionEngine::i_fstore_1;
    _instructionFunctions[0x45] = &ExecutionEngine::i_fstore_2;
    _instructionFunctions[0x46] = &ExecutionEngine::i_fstore_3;
    _instructionFunctions[0x47] = &ExecutionEngine::i_dstore_0;
    _instructionFunctions[0x48] = &ExecutionEngine::i_dstore_1;
    _instructionFunctions[0x49] = &ExecutionEngine::i_dstore_2;
    _instructionFunctions[0x4a] = &ExecutionEngine::i_dstore_3;
    _instructionFunctions[0x4b] = &ExecutionEngine::i_astore_0;
    _instructionFunctions[0x4c] = &ExecutionEngine::i_astore_1;
    _instructionFunctions[0x4d] = &ExecutionEngine::i_astore_2;
    _instructionFunctions[0x4e] = &ExecutionEngine::i_astore_3;
    _instructionFunctions[0x4f] = &ExecutionEngine::i_iastore;
    _instructionFunctions[0x50] = &ExecutionEngine::i_lastore;
    _instructionFunctions[0x51] = &ExecutionEngine::i_fastore;
    _instructionFunctions[0x52] = &ExecutionEngine::i_dastore;
    _instructionFunctions[0x53] = &ExecutionEngine::i_aastore;
    _instructionFunctions[0x54] = &ExecutionEngine::i_bastore;
    _instructionFunctions[0x55] = &ExecutionEngine::i_castore;
    _instructionFunctions[0x56] = &ExecutionEngine::i_sastore;
    _instructionFunctions[0x57] = &ExecutionEngine::i_pop;
    _instructionFunctions[0x58] = &ExecutionEngine::i_pop2;
    _instructionFunctions[0x59] = &ExecutionEngine::i_dup;
    _instructionFunctions[0x5a] = &ExecutionEngine::i_dup2_x1;
    _instructionFunctions[0x5b] = &ExecutionEngine::i_dup2_x2;
    _instructionFunctions[0x5c] = &ExecutionEngine::i_dup2;
    _instructionFunctions[0x5d] = &ExecutionEngine::i_dup2_x1;
    _instructionFunctions[0x5e] = &ExecutionEngine::i_dup2_x2;
    _instructionFunctions[0x5f] = &ExecutionEngine::i_swap;
    _instructionFunctions[0x60] = &ExecutionEngine::i_iadd;
    _instructionFunctions[0x61] = &ExecutionEngine::i_ladd;
    _instructionFunctions[0x62] = &ExecutionEngine::i_fadd;
    _instructionFunctions[0x63] = &ExecutionEngine::i_dadd;
    _instructionFunctions[0x64] = &ExecutionEngine::i_isub;
    _instructionFunctions[0x65] = &ExecutionEngine::i_lsub;
    _instructionFunctions[0x66] = &ExecutionEngine::i_fsub;
    _instructionFunctions[0x67] = &ExecutionEngine::i_dsub;
    _instructionFunctions[0x68] = &ExecutionEngine::i_imul;
    _instructionFunctions[0x69] = &ExecutionEngine::i_lmul;
    _instructionFunctions[0x6a] = &ExecutionEngine::i_fmul;
    _instructionFunctions[0x6b] = &ExecutionEngine::i_dmul;
    _instructionFunctions[0x6c] = &ExecutionEngine::i_idiv;
    _instructionFunctions[0x6d] = &ExecutionEngine::i_ldiv;
    _instructionFunctions[0x6e] = &ExecutionEngine::i_fdiv;
    _instructionFunctions[0x6f] = &ExecutionEngine::i_ddiv;
    _instructionFunctions[0x70] = &ExecutionEngine::i_irem;
    _instructionFunctions[0x71] = &ExecutionEngine::i_lrem;
    _instructionFunctions[0x72] = &ExecutionEngine::i_frem;
    _instructionFunctions[0x73] = &ExecutionEngine::i_drem;
    _instructionFunctions[0x74] = &ExecutionEngine::i_ineg;
    _instructionFunctions[0x75] = &ExecutionEngine::i_lneg;
    _instructionFunctions[0x76] = &ExecutionEngine::i_fneg;
    _instructionFunctions[0x77] = &ExecutionEngine::i_dneg;
    _instructionFunctions[0x78] = &ExecutionEngine::i_ishl;
    _instructionFunctions[0x79] = &ExecutionEngine::i_lshl;
    _instructionFunctions[0x7a] = &ExecutionEngine::i_ishr;
    _instructionFunctions[0x7b] = &ExecutionEngine::i_lshr;
    _instructionFunctions[0x7c] = &ExecutionEngine::i_iushr;
    _instructionFunctions[0x7d] = &ExecutionEngine::i_lushr;
    _instructionFunctions[0x7e] = &ExecutionEngine::i_iand;
    _instructionFunctions[0x7f] = &ExecutionEngine::i_land;
    _instructionFunctions[0x80] = &ExecutionEngine::i_ior;
    _instructionFunctions[0x81] = &ExecutionEngine::i_lor;
    _instructionFunctions[0x82] = &ExecutionEngine::i_ixor;
    _instructionFunctions[0x83] = &ExecutionEngine::i_lxor;
    _instructionFunctions[0x84] = &ExecutionEngine::i_iinc;
    _instructionFunctions[0x85] = &ExecutionEngine::i_i2l;
    _instructionFunctions[0x86] = &ExecutionEngine::i_i2f;
    _instructionFunctions[0x87] = &ExecutionEngine::i_i2d;
    _instructionFunctions[0x88] = &ExecutionEngine::i_l2i;
    _instructionFunctions[0x89] = &ExecutionEngine::i_l2f;
    _instructionFunctions[0x8a] = &ExecutionEngine::i_l2d;
    _instructionFunctions[0x8b] = &ExecutionEngine::i_f2i;
    _instructionFunctions[0x8c] = &ExecutionEngine::i_f2l;
    _instructionFunctions[0x8d] = &ExecutionEngine::i_f2d;
    _instructionFunctions[0x8e] = &ExecutionEngine::i_d2i;
    _instructionFunctions[0x8f] = &ExecutionEngine::i_d2l;
    _instructionFunctions[0x90] = &ExecutionEngine::i_d2f;
    _instructionFunctions[0x91] = &ExecutionEngine::i_i2b;
    _instructionFunctions[0x92] = &ExecutionEngine::i_i2c;
    _instructionFunctions[0x93] = &ExecutionEngine::i_i2s;
    _instructionFunctions[0x94] = &ExecutionEngine::i_lcmp;
    _instructionFunctions[0x95] = &ExecutionEngine::i_fcmpl;
    _instructionFunctions[0x96] = &ExecutionEngine::i_fcmpg;
    _instructionFunctions[0x97] = &ExecutionEngine::i_dcmpl;
    _instructionFunctions[0x98] = &ExecutionEngine::i_dcmpg;
    _instructionFunctions[0x99] = &ExecutionEngine::i_ifeq;
    _instructionFunctions[0x9a] = &ExecutionEngine::i_ifne;
    _instructionFunctions[0x9b] = &ExecutionEngine::i_iflt;
    _instructionFunctions[0x9c] = &ExecutionEngine::i_ifge;
    _instructionFunctions[0x9d] = &ExecutionEngine::i_ifgt;
    _instructionFunctions[0x9e] = &ExecutionEngine::i_ifle;
    _instructionFunctions[0x9f] = &ExecutionEngine::i_if_icmpeq;
    _instructionFunctions[0xa0] = &ExecutionEngine::i_if_icmpne;
    _instructionFunctions[0xa1] = &ExecutionEngine::i_if_icmplt;
    _instructionFunctions[0xa2] = &ExecutionEngine::i_if_icmpge;
    _instructionFunctions[0xa3] = &ExecutionEngine::i_if_icmpgt;
    _instructionFunctions[0xa4] = &ExecutionEngine::i_if_icmple;
    _instructionFunctions[0xa5] = &ExecutionEngine::i_if_acmpeq;
    _instructionFunctions[0xa6] = &ExecutionEngine::i_if_acmpne;
    _instructionFunctions[0xa7] = &ExecutionEngine::i_goto;
    _instructionFunctions[0xa8] = &ExecutionEngine::i_jsr;
    _instructionFunctions[0xa9] = &ExecutionEngine::i_ret;
    _instructionFunctions[0xaa] = &ExecutionEngine::i_tableswitch;
    _instructionFunctions[0xab] = &ExecutionEngine::i_lookupswitch;
    _instructionFunctions[0xac] = &ExecutionEngine::i_ireturn;
    _instructionFunctions[0xad] = &ExecutionEngine::i_lreturn;
    _instructionFunctions[0xae] = &ExecutionEngine::i_freturn;
    _instructionFunctions[0xaf] = &ExecutionEngine::i_dreturn;
    _instructionFunctions[0xb0] = &ExecutionEngine::i_areturn;
    _instructionFunctions[0xb1] = &ExecutionEngine::i_return;
    _instructionFunctions[0xb2] = &ExecutionEngine::i_getstatic;
    _instructionFunctions[0xb3] = &ExecutionEngine::i_putstatic;
    _instructionFunctions[0xb4] = &ExecutionEngine::i_getfield;
    _instructionFunctions[0xb5] = &ExecutionEngine::i_putfield;
    _instructionFunctions[0xb6] = &ExecutionEngine::i_invokevirtual;
    _instructionFunctions[0xb7] = &ExecutionEngine::i_invokespecial;
    _instructionFunctions[0xb8] = &ExecutionEngine::i_invokestatic;
    _instructionFunctions[0xb9] = &ExecutionEngine::i_invokeinterface;
    _instructionFunctions[0xbb] = &ExecutionEngine::i_new;
    _instructionFunctions[0xbc] = &ExecutionEngine::i_newarray;
    _instructionFunctions[0xbd] = &ExecutionEngine::i_anewarray;
    _instructionFunctions[0xbe] = &ExecutionEngine::i_arraylength;
    _instructionFunctions[0xbf] = &ExecutionEngine::i_athrow;
    _instructionFunctions[0xc0] = &ExecutionEngine::i_checkcast;
    _instructionFunctions[0xc1] = &ExecutionEngine::i_instanceof;
    _instructionFunctions[0xc2] = &ExecutionEngine::i_monitorenter;
    _instructionFunctions[0xc3] = &ExecutionEngine::i_monitorexit;
    _instructionFunctions[0xc4] = &ExecutionEngine::i_wide;
    _instructionFunctions[0xc5] = &ExecutionEngine::i_multianewarray;
    _instructionFunctions[0xc6] = &ExecutionEngine::i_ifnull;
    _instructionFunctions[0xc7] = &ExecutionEngine::i_ifnonnull;
    _instructionFunctions[0xc8] = &ExecutionEngine::i_goto_w;
    _instructionFunctions[0xc9] = &ExecutionEngine::i_jsr_w;
}